

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::toString_abi_cxx11_(int value)

{
  ostream *this;
  void *this_00;
  int in_ESI;
  string *in_RDI;
  ostringstream oss;
  ostringstream local_188 [380];
  int local_c;
  
  local_c = in_ESI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  if (local_c < 0x2001) {
    std::ostream::operator<<(local_188,local_c);
  }
  else {
    this = std::operator<<((ostream *)local_188,"0x");
    this_00 = (void *)std::ostream::operator<<(this,std::hex);
    std::ostream::operator<<(this_00,local_c);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string toString( int value ) {
    std::ostringstream oss;
    if( value > 8192 )
        oss << "0x" << std::hex << value;
    else
        oss << value;
    return oss.str();
}